

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O0

int Kit_TruthStats(uint *pTruth,int nVars,Vec_Int_t *vMemory)

{
  uint uVar1;
  int iVar2;
  Kit_Graph_t *pGraph_00;
  Kit_Node_t *pNode;
  int nLevels;
  int nNodes;
  Kit_Graph_t *pGraph;
  Vec_Int_t *vMemory_local;
  int nVars_local;
  uint *pTruth_local;
  
  pGraph_00 = Kit_TruthToGraph(pTruth,nVars,vMemory);
  uVar1 = Kit_GraphNodeNum(pGraph_00);
  pNode = Kit_GraphNodeLast(pGraph_00);
  iVar2 = Kit_GraphLevelNum_rec(pGraph_00,pNode);
  Kit_GraphFree(pGraph_00);
  return iVar2 << 0x10 | uVar1;
}

Assistant:

int Kit_TruthStats( unsigned * pTruth, int nVars, Vec_Int_t * vMemory )
{
    Kit_Graph_t * pGraph = Kit_TruthToGraph( pTruth, nVars, vMemory );
    int nNodes  = Kit_GraphNodeNum( pGraph );
    int nLevels = Kit_GraphLevelNum_rec( pGraph, Kit_GraphNodeLast(pGraph) );
    Kit_GraphFree( pGraph );
    return (nLevels << 16) | nNodes;
}